

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleSampleMaskiTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::MultisampleTextureSampleMaskiGettersTest::iterate
          (MultisampleTextureSampleMaskiGettersTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  int local_4c;
  int local_48;
  GLint int_value;
  GLint mask;
  uint n_mask;
  int index;
  uint n_valid_masks;
  GLuint valid_masks [6];
  GLint gl_max_sample_mask_words_value;
  Functions *gl;
  MultisampleTextureSampleMaskiGettersTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  valid_masks[5] = 0;
  (**(code **)(lVar4 + 0x868))(0x8e59,valid_masks + 5);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Failed to retrieve GL_MAX_SAMPLE_MASK_WORDS value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleSampleMaskiTests.cpp"
                  ,0x93);
  _index = 0xffffffff00000000;
  valid_masks[0] = 0xff000000;
  valid_masks[1] = 0xff0000;
  valid_masks[2] = 0xff00;
  valid_masks[3] = 0xff;
  n_mask = 6;
  mask = 0;
  do {
    if ((int)valid_masks[5] <= mask) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    for (int_value = 0; (uint)int_value < 6; int_value = int_value + 1) {
      local_48 = (&index)[(uint)int_value];
      (**(code **)(lVar4 + 0x1258))(mask,local_48);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"A valid glSampleMaski() call resulted in an error",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleSampleMaskiTests.cpp"
                      ,0xa2);
      local_4c = -1;
      (**(code **)(lVar4 + 0x860))(0x8e52,mask,&local_4c);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"A valid glGetIntegeri_v() call resulted in an error",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleSampleMaskiTests.cpp"
                      ,0xa8);
      if (local_4c != local_48) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid sample mask reported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleSampleMaskiTests.cpp"
                   ,0xac);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    mask = mask + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureSampleMaskiGettersTest::iterate()
{
	/* Get GL_MAX_SAMPLE_MASK_WORDS value */
	const glw::Functions& gl							 = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_sample_mask_words_value = 0;

	gl.getIntegerv(GL_MAX_SAMPLE_MASK_WORDS, &gl_max_sample_mask_words_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_SAMPLE_MASK_WORDS value");

	/* Iterate over valid index & mask values */
	const glw::GLuint  valid_masks[] = { 0, 0xFFFFFFFF, 0xFF000000, 0x00FF0000, 0x0000FF00, 0x000000FF };
	const unsigned int n_valid_masks = sizeof(valid_masks) / sizeof(valid_masks[0]);

	for (int index = 0; index < gl_max_sample_mask_words_value; ++index)
	{
		for (unsigned int n_mask = 0; n_mask < n_valid_masks; ++n_mask)
		{
			glw::GLint mask = valid_masks[n_mask];

			/* Make sure a valid glSampleMaski() call does not result in an error */
			gl.sampleMaski(index, mask);

			GLU_EXPECT_NO_ERROR(gl.getError(), "A valid glSampleMaski() call resulted in an error");

			/* Check the property value as reported by implementation */
			glw::GLint int_value = -1;

			gl.getIntegeri_v(GL_SAMPLE_MASK_VALUE, index, &int_value);
			GLU_EXPECT_NO_ERROR(gl.getError(), "A valid glGetIntegeri_v() call resulted in an error");

			if (int_value != mask)
			{
				TCU_FAIL("Invalid sample mask reported");
			}
		} /* for (all masks) */
	}	 /* for (all valid index argument values) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}